

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCTET_STRING.c
# Opt level: O2

asn_enc_rval_t *
OCTET_STRING_encode_der
          (asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,void *sptr,int tag_mode,
          ber_tlv_tag_t tag,asn_app_consume_bytes_f *cb,void *app_key)

{
  asn_OS_Subvariant aVar1;
  int iVar2;
  ssize_t sVar3;
  asn_OCTET_STRING_specifics_t *paVar4;
  ulong uVar5;
  uint8_t b;
  uint8_t b_1;
  asn_TYPE_descriptor_t *local_38;
  
  paVar4 = &asn_DEF_OCTET_STRING_specs;
  if ((asn_OCTET_STRING_specifics_t *)td->specifics != (asn_OCTET_STRING_specifics_t *)0x0) {
    paVar4 = (asn_OCTET_STRING_specifics_t *)td->specifics;
  }
  aVar1 = paVar4->subvariant;
  local_38 = td;
  if ((tag_mode == 1) || (aVar1 != ASN_OSUBV_ANY)) {
    sVar3 = der_write_tags(td,(ulong)(aVar1 == ASN_OSUBV_BIT) + (long)*(int *)((long)sptr + 8),
                           tag_mode,(uint)(aVar1 == ASN_OSUBV_ANY),tag,cb,app_key);
    if (sVar3 == -1) {
      __return_storage_ptr__->encoded = -1;
      __return_storage_ptr__->failed_type = td;
    }
    else {
      if (cb == (asn_app_consume_bytes_f *)0x0) goto LAB_00146f80;
      uVar5 = 0;
      if (aVar1 == ASN_OSUBV_BIT) {
        b = (byte)*(uint *)((long)sptr + 0xc) & 7;
        uVar5 = 0;
        if ((*(uint *)((long)sptr + 0xc) & 7) != 0) {
          uVar5 = (ulong)(*(int *)((long)sptr + 8) != 0);
        }
        iVar2 = (*cb)(&b,1,app_key);
        if (-1 < iVar2) {
          sVar3 = sVar3 + 1;
          goto LAB_00146f2c;
        }
      }
      else {
LAB_00146f2c:
        iVar2 = (*cb)(*sptr,(long)*(int *)((long)sptr + 8) - uVar5,app_key);
        if (-1 < iVar2) {
          if ((int)uVar5 != 0) {
            b_1 = (byte)(0xff << (*(byte *)((long)sptr + 0xc) & 0x1f)) &
                  *(byte *)(*sptr + -1 + (long)*(int *)((long)sptr + 8));
            iVar2 = (*cb)(&b_1,1,app_key);
            if (iVar2 < 0) goto LAB_00146f9f;
          }
          __return_storage_ptr__->encoded = sVar3 + *(int *)((long)sptr + 8);
          goto LAB_00146f96;
        }
      }
LAB_00146f9f:
      __return_storage_ptr__->encoded = -1;
      __return_storage_ptr__->failed_type = local_38;
    }
    __return_storage_ptr__->structure_ptr = sptr;
  }
  else {
    sVar3 = 0;
    uVar5 = 0;
    if (cb != (asn_app_consume_bytes_f *)0x0) goto LAB_00146f2c;
LAB_00146f80:
    __return_storage_ptr__->encoded =
         (ulong)(aVar1 == ASN_OSUBV_BIT) + *(int *)((long)sptr + 8) + sVar3;
LAB_00146f96:
    __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
    __return_storage_ptr__->structure_ptr = (void *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
OCTET_STRING_encode_der(asn_TYPE_descriptor_t *td, void *sptr,
	int tag_mode, ber_tlv_tag_t tag,
	asn_app_consume_bytes_f *cb, void *app_key) {
	asn_enc_rval_t er;
	asn_OCTET_STRING_specifics_t *specs = td->specifics
				? (asn_OCTET_STRING_specifics_t *)td->specifics
				: &asn_DEF_OCTET_STRING_specs;
	BIT_STRING_t *st = (BIT_STRING_t *)sptr;
	enum asn_OS_Subvariant type_variant = specs->subvariant;
	int fix_last_byte = 0;

	ASN_DEBUG("%s %s as OCTET STRING",
		cb?"Estimating":"Encoding", td->name);

	/*
	 * Write tags.
	 */
	if(type_variant != ASN_OSUBV_ANY || tag_mode == 1) {
		er.encoded = der_write_tags(td,
				(type_variant == ASN_OSUBV_BIT) + st->size,
			tag_mode, type_variant == ASN_OSUBV_ANY, tag,
			cb, app_key);
		if(er.encoded == -1) {
			er.failed_type = td;
			er.structure_ptr = sptr;
			return er;
		}
	} else {
		/* Disallow: [<tag>] IMPLICIT ANY */
		assert(type_variant != ASN_OSUBV_ANY || tag_mode != -1);
		er.encoded = 0;
	}

	if(!cb) {
		er.encoded += (type_variant == ASN_OSUBV_BIT) + st->size;
		ASN__ENCODED_OK(er);
	}

	/*
	 * Prepare to deal with the last octet of BIT STRING.
	 */
	if(type_variant == ASN_OSUBV_BIT) {
		uint8_t b = st->bits_unused & 0x07;
		if(b && st->size) fix_last_byte = 1;
		ASN__CALLBACK(&b, 1);
		er.encoded++;
	}

	/* Invoke callback for the main part of the buffer */
	ASN__CALLBACK(st->buf, st->size - fix_last_byte);

	/* The last octet should be stripped off the unused bits */
	if(fix_last_byte) {
		uint8_t b = st->buf[st->size-1] & (0xff << st->bits_unused);
		ASN__CALLBACK(&b, 1);
	}

	er.encoded += st->size;
	ASN__ENCODED_OK(er);
cb_failed:
	ASN__ENCODE_FAILED;
}